

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.cpp
# Opt level: O1

void next_move(Node *root,int depth)

{
  char cVar1;
  int iVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  int row;
  long lVar6;
  pointer root_00;
  
  if (depth < 3) {
    lVar6 = 2;
    lVar5 = 0x1a;
    do {
      lVar4 = 0;
      do {
        cVar1 = (*root)->board[0][lVar4 + lVar5];
        row = (int)lVar6;
        iVar2 = (int)lVar4;
        if ((*root)->cur_side == false) {
          switch(cVar1) {
          case 'k':
            bVar3 = true;
            goto LAB_00103db6;
          case 'l':
          case 'm':
          case 'o':
            break;
          case 'n':
            bVar3 = true;
            goto LAB_00103e5c;
          case 'p':
            bVar3 = true;
            goto LAB_00103e47;
          case 'q':
            bVar3 = true;
            goto LAB_00103e71;
          case 'r':
            bVar3 = true;
            goto LAB_00103e32;
          default:
            if (cVar1 == 'b') {
              bVar3 = true;
              goto LAB_00103e1d;
            }
          }
        }
        else {
          switch(cVar1) {
          case 'K':
            bVar3 = false;
LAB_00103db6:
            king(root,row,iVar2 + 2,bVar3);
            break;
          case 'L':
          case 'M':
          case 'O':
            break;
          case 'N':
            bVar3 = false;
LAB_00103e5c:
            knight(root,row,iVar2 + 2,bVar3);
            break;
          case 'P':
            bVar3 = false;
LAB_00103e47:
            pawn(root,row,iVar2 + 2,bVar3);
            break;
          case 'Q':
            bVar3 = false;
LAB_00103e71:
            queen(root,row,iVar2 + 2,bVar3);
            break;
          case 'R':
            bVar3 = false;
LAB_00103e32:
            rook(root,row,iVar2 + 2,bVar3);
            break;
          default:
            if (cVar1 == 'B') {
              bVar3 = false;
LAB_00103e1d:
              bishop(root,row,iVar2 + 2,bVar3);
            }
          }
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 8);
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0xc;
    } while (lVar6 != 10);
    root_00 = ((*root)->next).super__Vector_base<tNode_*,_std::allocator<tNode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (root_00 !=
        ((*root)->next).super__Vector_base<tNode_*,_std::allocator<tNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        next_move(root_00,depth + 1);
        root_00 = root_00 + 1;
      } while (root_00 !=
               ((*root)->next).super__Vector_base<tNode_*,_std::allocator<tNode_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
  }
  return;
}

Assistant:

void next_move(Node& root, int depth){
    if(depth >= MAX_DEPTH)
        return;

    int i, j;
    for(i=2; i<10; i++){
        for(j=2; j<10; j++){
            char c = root->board[i][j];

            if(0 == root->cur_side){ // WHITE has moved. Looking for BLACK pieces to move
                switch(c){
                    case 'q': queen(root, i, j, 1); break;
                    case 'r': rook(root, i, j, 1); break;
                    case 'b': bishop(root, i, j, 1); break;
                    case 'n': knight(root, i, j, 1); break;
                    case 'p': pawn(root, i, j, 1); break;
                    case 'k': king(root, i, j, 1); break;
                }
            }
            else{ // BLACK has moved. Looking for WHITE pieces to move.
                switch(c){
                    case 'Q': queen(root, i, j, 0); break;
                    case 'R': rook(root, i, j, 0); break;
                    case 'B': bishop(root, i, j, 0); break;
                    case 'N': knight(root, i, j, 0); break;
                    case 'P': pawn(root, i, j, 0); break;
                    case 'K': king(root, i, j, 0); break;
                }
            }
        }
    }
    // Iterates through each of the generated possibilities
    vector<Node>::iterator it;
    for(it=root->next.begin(); it!=root->next.end(); it++)
        next_move(*it, depth+1);
}